

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

bool __thiscall QListView::isIndexHidden(QListView *this,QModelIndex *index)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_00;
  QAbstractItemModel *pQVar4;
  char cVar5;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Bucket BVar8;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  iVar1 = index->r;
  local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  plVar3 = *(long **)(lVar2 + 0x2f8);
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)&local_58,(QPersistentModelIndex *)(lVar2 + 0x3b8));
  (**(code **)(*plVar3 + 0x60))(&local_78,plVar3,iVar1,0,(QModelIndex *)&local_58);
  local_48.ptr = local_68.ptr;
  local_58 = local_78;
  puStack_50 = puStack_70;
  this_00 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
              **)(*(long *)(*(long *)(lVar2 + 0x2f8) + 8) + 0x90);
  if (this_00 !=
      (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_> *)
      0x0) {
    BVar8 = QHashPrivate::
            Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
            ::findBucket<QtPrivate::QModelIndexWrapper>(this_00,(QModelIndexWrapper *)&local_58);
    if ((BVar8.span[BVar8.index] != (Span)0xff) && (*(long *)(BVar8.span + 0x80) != 0)) {
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)&local_58,(QModelIndex *)&local_78);
      if (*(Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> **)(lVar2 + 0x588) ==
          (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
      }
      else {
        pNVar6 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                 findNode<QPersistentModelIndex>
                           (*(Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> **)
                             (lVar2 + 0x588),(QPersistentModelIndex *)&local_58);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
        if (pNVar6 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) {
          pQVar4 = (index->m).ptr;
          if (pQVar4 == (QAbstractItemModel *)0x0) {
            local_58 = (QPersistentModelIndexData *)0xffffffffffffffff;
            puStack_50 = (undefined1 *)0x0;
            local_48.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)pQVar4 + 0x68))(&local_58,pQVar4,index);
          }
          cVar5 = comparesEqual((QPersistentModelIndex *)(lVar2 + 0x3b8),(QModelIndex *)&local_58);
          if (cVar5 != '\0') {
            bVar7 = index->c == *(int *)(lVar2 + 0x590);
            goto LAB_0056ed10;
          }
        }
      }
    }
  }
  bVar7 = false;
LAB_0056ed10:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QListView::isIndexHidden(const QModelIndex &index) const
{
    Q_D(const QListView);
    return (d->isHidden(index.row())
            && (index.parent() == d->root)
            && index.column() == d->column);
}